

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomvar.cpp
# Opt level: O3

void __thiscall MetaSim::DetVar::DetVar(DetVar *this,string *filename)

{
  iterator __position;
  pointer pcVar1;
  long lVar2;
  char cVar3;
  long *plVar4;
  Exc *this_00;
  long *plVar5;
  string errMsg;
  double v;
  ifstream inFile;
  long *local_2e0;
  long local_2d0;
  long lStack_2c8;
  double local_2c0;
  string local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  double local_238 [4];
  byte abStack_218 [488];
  
  (this->super_RandomVar)._vptr_RandomVar = (_func_int **)&PTR___cxa_pure_virtual_00123968;
  (this->super_RandomVar)._gen = (RandomGen *)RandomVar::_pstdgen;
  __regrandvar_init();
  (this->super_RandomVar)._vptr_RandomVar = (_func_int **)&PTR_clone_001239a8;
  (this->_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(local_238);
  std::ifstream::open((char *)local_238,(_Ios_Openmode)(filename->_M_dataplus)._M_p);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    if ((abStack_218[*(long *)((long)local_238[0] + -0x18)] & 2) == 0) {
      do {
        std::istream::_M_extract<double>(local_238);
        __position._M_current =
             (this->_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&this->_array,__position,&local_2c0);
        }
        else {
          *__position._M_current = local_2c0;
          (this->_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      } while ((abStack_218[*(long *)((long)local_238[0] + -0x18)] & 2) == 0);
    }
    std::ifstream::close();
    this->_count = 0;
    std::ifstream::~ifstream(local_238);
    return;
  }
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,pcVar1,pcVar1 + filename->_M_string_length);
  std::operator+(&local_278,"Unable to open RandFile",&local_298);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_278);
  local_2e0 = (long *)*plVar4;
  plVar5 = plVar4 + 2;
  if (local_2e0 == plVar5) {
    local_2d0 = *plVar5;
    lStack_2c8 = plVar4[3];
    local_2e0 = &local_2d0;
  }
  else {
    local_2d0 = *plVar5;
  }
  lVar2 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  this_00 = (Exc *)__cxa_allocate_exception(0x30);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2b8,local_2e0,lVar2 + (long)local_2e0);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"DetVar","");
  RandomVar::Exc::Exc(this_00,&local_2b8,&local_258);
  __cxa_throw(this_00,&RandomVar::Exc::typeinfo,BaseExc::~BaseExc);
}

Assistant:

DetVar::DetVar(const std::string &filename) :
        _array()
    {
        DBGENTER(_RANDOMVAR_DBG_LEV);
        ifstream inFile;
        double v;

        DBGPRINT_2("Reading from ", filename);

        inFile.open(filename.c_str());
        if (!inFile.is_open()) {
            string errMsg = Exc::_FILEOPEN  + string(filename) + "\n";
            throw Exc(errMsg, "DetVar");
        }
        while (!inFile.eof()) {
            inFile >> v;
            _array.push_back(v);
            DBGVAR(_array.back());
        }
        inFile.close();
        _count = 0;
    }